

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool VerifyScript(CScript *scriptSig,CScript *scriptPubKey,CScriptWitness *witness,uint flags,
                 BaseSignatureChecker *checker,ScriptError *serror)

{
  pointer puVar1;
  pointer puVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  ScriptError SVar12;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  CScriptWitness *witness_00;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  CScript pubKey2;
  iterator local_160;
  allocator_type local_151;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_150;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_138;
  int local_11c;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_118;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_f8;
  direct_or_indirect local_d8;
  uint local_bc;
  undefined1 local_b8 [28];
  uint uStack_9c;
  undefined2 local_98;
  bool local_90;
  uchar local_8e [32];
  bool local_6e;
  bool local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (VerifyScript(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int,BaseSignatureChecker_const&,ScriptError_t*)
      ::emptyWitness == '\0') {
    VerifyScript();
  }
  witness_00 = &VerifyScript::emptyWitness;
  if (witness != (CScriptWitness *)0x0) {
    witness_00 = witness;
  }
  if (serror != (ScriptError *)0x0) {
    *serror = SCRIPT_ERR_UNKNOWN_ERROR;
  }
  if (((flags & 0x20) != 0) && (bVar8 = CScript::IsPushOnly(scriptSig), !bVar8)) {
    if (serror != (ScriptError *)0x0) {
      *serror = SCRIPT_ERR_SIG_PUSHONLY;
    }
    bVar8 = false;
    goto LAB_001f0cc6;
  }
  local_f8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90 = false;
  local_40 = false;
  local_b8._0_8_ = (char *)0x0;
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  uStack_9c._0_1_ = '\0';
  uStack_9c._1_1_ = '\0';
  uStack_9c._2_1_ = '\0';
  uStack_9c._3_1_ = '\0';
  local_98._0_1_ = '\0';
  local_98._1_1_ = false;
  local_8e[0] = '\0';
  local_8e[1] = '\0';
  local_8e[2] = '\0';
  local_8e[3] = '\0';
  local_8e[4] = '\0';
  local_8e[5] = '\0';
  local_8e[6] = '\0';
  local_8e[7] = '\0';
  local_8e[8] = '\0';
  local_8e[9] = '\0';
  local_8e[10] = '\0';
  local_8e[0xb] = '\0';
  local_8e[0xc] = '\0';
  local_8e[0xd] = '\0';
  local_8e[0xe] = '\0';
  local_8e[0xf] = '\0';
  local_8e[0x10] = '\0';
  local_8e[0x11] = '\0';
  local_8e[0x12] = '\0';
  local_8e[0x13] = '\0';
  local_8e[0x14] = '\0';
  local_8e[0x15] = '\0';
  local_8e[0x16] = '\0';
  local_8e[0x17] = '\0';
  local_8e[0x18] = '\0';
  local_8e[0x19] = '\0';
  local_8e[0x1a] = '\0';
  local_8e[0x1b] = '\0';
  local_8e[0x1c] = '\0';
  local_8e[0x1d] = '\0';
  local_8e[0x1e] = '\0';
  local_8e[0x1f] = '\0';
  local_6e = false;
  bVar8 = EvalScript(&local_f8,scriptSig,flags,checker,BASE,(ScriptExecutionData *)local_b8,serror);
  if (bVar8) {
    if ((flags & 1) != 0) {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&local_118,&local_f8);
    }
    local_90 = false;
    local_40 = false;
    local_b8._0_8_ = (char *)0x0;
    local_b8[8] = '\0';
    local_b8[9] = '\0';
    local_b8[10] = '\0';
    local_b8[0xb] = '\0';
    local_b8[0xc] = '\0';
    local_b8[0xd] = '\0';
    local_b8[0xe] = '\0';
    local_b8[0xf] = '\0';
    local_b8[0x10] = '\0';
    local_b8[0x11] = '\0';
    local_b8[0x12] = '\0';
    local_b8[0x13] = '\0';
    local_b8[0x14] = '\0';
    local_b8[0x15] = '\0';
    local_b8[0x16] = '\0';
    local_b8[0x17] = '\0';
    local_b8[0x18] = '\0';
    local_b8[0x19] = '\0';
    local_b8[0x1a] = '\0';
    local_b8[0x1b] = '\0';
    uStack_9c._0_1_ = '\0';
    uStack_9c._1_1_ = '\0';
    uStack_9c._2_1_ = '\0';
    uStack_9c._3_1_ = '\0';
    local_98._0_1_ = '\0';
    local_98._1_1_ = false;
    local_8e[0] = '\0';
    local_8e[1] = '\0';
    local_8e[2] = '\0';
    local_8e[3] = '\0';
    local_8e[4] = '\0';
    local_8e[5] = '\0';
    local_8e[6] = '\0';
    local_8e[7] = '\0';
    local_8e[8] = '\0';
    local_8e[9] = '\0';
    local_8e[10] = '\0';
    local_8e[0xb] = '\0';
    local_8e[0xc] = '\0';
    local_8e[0xd] = '\0';
    local_8e[0xe] = '\0';
    local_8e[0xf] = '\0';
    local_8e[0x10] = '\0';
    local_8e[0x11] = '\0';
    local_8e[0x12] = '\0';
    local_8e[0x13] = '\0';
    local_8e[0x14] = '\0';
    local_8e[0x15] = '\0';
    local_8e[0x16] = '\0';
    local_8e[0x17] = '\0';
    local_8e[0x18] = '\0';
    local_8e[0x19] = '\0';
    local_8e[0x1a] = '\0';
    local_8e[0x1b] = '\0';
    local_8e[0x1c] = '\0';
    local_8e[0x1d] = '\0';
    local_8e[0x1e] = '\0';
    local_8e[0x1f] = '\0';
    local_6e = false;
    bVar8 = EvalScript(&local_f8,scriptPubKey,flags,checker,BASE,(ScriptExecutionData *)local_b8,
                       serror);
    if (!bVar8) goto LAB_001f0cad;
    if (local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001f0ca2:
      if (serror != (ScriptError *)0x0) {
        *serror = SCRIPT_ERR_EVAL_FALSE;
      }
      goto LAB_001f0cad;
    }
    puVar2 = local_f8.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (long)local_f8.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar2;
    bVar8 = uVar14 != 0;
    if (bVar8) {
      if (*puVar2 == '\0') {
        uVar15 = 1;
        do {
          bVar8 = uVar15 < uVar14;
          if (uVar14 <= uVar15) goto LAB_001f0c49;
          puVar1 = puVar2 + uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (*puVar1 == '\0');
      }
      uVar14 = 1;
    }
LAB_001f0c49:
    if ((!bVar8) || ((uVar14 & 1) == 0)) goto LAB_001f0ca2;
    local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((flags >> 0xb & 1) == 0) ||
       (bVar8 = CScript::IsWitnessProgram(scriptPubKey,&local_11c,&local_138), !bVar8)) {
      bVar8 = false;
LAB_001f0cf4:
      if (((flags & 1) != 0) && (bVar9 = CScript::IsPayToScriptHash(scriptPubKey), bVar9)) {
        bVar9 = CScript::IsPushOnly(scriptSig);
        pvVar7 = local_f8.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pvVar6 = local_f8.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pvVar5 = local_f8.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pvVar3 = local_118.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (!bVar9) {
          SVar12 = SCRIPT_ERR_SIG_PUSHONLY;
          goto LAB_001f101b;
        }
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_118.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_118.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_118.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_118.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pvVar5;
        local_118.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar6;
        local_118.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar7;
        if (pvVar3 == pvVar4) {
          __assert_fail("!stack.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                        ,0x7e4,
                        "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                       );
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_d8.indirect_contents,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pvVar4[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )pvVar4[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        popstack(&local_f8);
        local_90 = false;
        local_40 = false;
        local_b8._0_8_ = (char *)0x0;
        local_b8[8] = '\0';
        local_b8[9] = '\0';
        local_b8[10] = '\0';
        local_b8[0xb] = '\0';
        local_b8[0xc] = '\0';
        local_b8[0xd] = '\0';
        local_b8[0xe] = '\0';
        local_b8[0xf] = '\0';
        local_b8[0x10] = '\0';
        local_b8[0x11] = '\0';
        local_b8[0x12] = '\0';
        local_b8[0x13] = '\0';
        local_b8[0x14] = '\0';
        local_b8[0x15] = '\0';
        local_b8[0x16] = '\0';
        local_b8[0x17] = '\0';
        local_b8[0x18] = '\0';
        local_b8[0x19] = '\0';
        local_b8[0x1a] = '\0';
        local_b8[0x1b] = '\0';
        uStack_9c._0_1_ = '\0';
        uStack_9c._1_1_ = '\0';
        uStack_9c._2_1_ = '\0';
        uStack_9c._3_1_ = '\0';
        local_98._0_1_ = '\0';
        local_98._1_1_ = false;
        local_8e[0] = '\0';
        local_8e[1] = '\0';
        local_8e[2] = '\0';
        local_8e[3] = '\0';
        local_8e[4] = '\0';
        local_8e[5] = '\0';
        local_8e[6] = '\0';
        local_8e[7] = '\0';
        local_8e[8] = '\0';
        local_8e[9] = '\0';
        local_8e[10] = '\0';
        local_8e[0xb] = '\0';
        local_8e[0xc] = '\0';
        local_8e[0xd] = '\0';
        local_8e[0xe] = '\0';
        local_8e[0xf] = '\0';
        local_8e[0x10] = '\0';
        local_8e[0x11] = '\0';
        local_8e[0x12] = '\0';
        local_8e[0x13] = '\0';
        local_8e[0x14] = '\0';
        local_8e[0x15] = '\0';
        local_8e[0x16] = '\0';
        local_8e[0x17] = '\0';
        local_8e[0x18] = '\0';
        local_8e[0x19] = '\0';
        local_8e[0x1a] = '\0';
        local_8e[0x1b] = '\0';
        local_8e[0x1c] = '\0';
        local_8e[0x1d] = '\0';
        local_8e[0x1e] = '\0';
        local_8e[0x1f] = '\0';
        local_6e = false;
        bVar9 = EvalScript(&local_f8,(CScript *)&local_d8.indirect_contents,flags,checker,BASE,
                           (ScriptExecutionData *)local_b8,serror);
        if (bVar9) {
          if ((local_f8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_f8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) ||
             (bVar9 = CastToBool(local_f8.
                                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + -1), !bVar9)) {
            SVar12 = SCRIPT_ERR_EVAL_FALSE;
LAB_001f0f84:
            if (serror != (ScriptError *)0x0) {
              *serror = SVar12;
            }
            goto LAB_001f0f8b;
          }
          bVar9 = true;
          if ((flags >> 0xb & 1) != 0) {
            local_160.ptr = (uchar *)&local_d8;
            bVar10 = CScript::IsWitnessProgram((CScript *)local_160.ptr,&local_11c,&local_138);
            if (bVar10) {
              local_b8[0x10] = '\0';
              local_b8[0x11] = '\0';
              local_b8[0x12] = '\0';
              local_b8[0x13] = '\0';
              local_b8[0x14] = '\0';
              local_b8[0x15] = '\0';
              local_b8[0x16] = '\0';
              local_b8[0x17] = '\0';
              local_b8[0x18] = '\0';
              local_b8[0x19] = '\0';
              local_b8[0x1a] = '\0';
              local_b8[0x1b] = '\0';
              uStack_9c._0_1_ = '\0';
              uStack_9c._1_1_ = '\0';
              uStack_9c._2_1_ = '\0';
              uStack_9c._3_1_ = '\0';
              local_b8._0_8_ = (char *)0x0;
              local_b8[8] = '\0';
              local_b8[9] = '\0';
              local_b8[10] = '\0';
              local_b8[0xb] = '\0';
              local_b8[0xc] = '\0';
              local_b8[0xd] = '\0';
              local_b8[0xe] = '\0';
              local_b8[0xf] = '\0';
              uVar11 = local_bc;
              if (0x1c < local_bc) {
                local_160.ptr = (uchar *)local_d8.indirect_contents.indirect;
                uVar11 = local_bc - 0x1d;
              }
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_150,local_160
                         ,(iterator)(local_160.ptr + (int)uVar11),&local_151);
              other = &CScript::operator<<((CScript *)local_b8,&local_150)->super_CScriptBase;
              bVar8 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator==
                                (&scriptSig->super_CScriptBase,other);
              if (local_150.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_150.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_150.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_150.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (0x1c < uStack_9c) {
                free((void *)local_b8._0_8_);
                local_b8._0_8_ = (char *)0x0;
              }
              if (!bVar8) {
                SVar12 = SCRIPT_ERR_WITNESS_MALLEATED_P2SH;
                bVar8 = true;
                goto LAB_001f0f84;
              }
              bVar8 = VerifyWitnessProgram
                                (witness_00,local_11c,&local_138,flags,checker,serror,true);
              if (!bVar8) {
                bVar8 = true;
                goto LAB_001f0f8b;
              }
              bVar9 = true;
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::resize(&local_f8,1);
              bVar8 = true;
            }
          }
        }
        else {
LAB_001f0f8b:
          bVar9 = false;
        }
        if (0x1c < local_bc) {
          free(local_d8.indirect_contents.indirect);
          local_d8.indirect_contents.indirect = (char *)0x0;
        }
        if (!bVar9) goto LAB_001f1044;
      }
      if ((flags >> 8 & 1) != 0) {
        if ((flags & 1) == 0) {
          __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                        ,0x80b,
                        "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                       );
        }
        if ((flags >> 0xb & 1) == 0) {
          __assert_fail("(flags & SCRIPT_VERIFY_WITNESS) != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                        ,0x80c,
                        "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                       );
        }
        if ((long)local_f8.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x18) {
          SVar12 = SCRIPT_ERR_CLEANSTACK;
          goto LAB_001f101b;
        }
      }
      if ((flags >> 0xb & 1) != 0) {
        if ((flags & 1) == 0) {
          __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                        ,0x816,
                        "bool VerifyScript(const CScript &, const CScript &, const CScriptWitness *, unsigned int, const BaseSignatureChecker &, ScriptError *)"
                       );
        }
        if ((!bVar8) &&
           ((witness_00->stack).
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (witness_00->stack).
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          SVar12 = SCRIPT_ERR_WITNESS_UNEXPECTED;
          goto LAB_001f101b;
        }
      }
      SVar12 = SCRIPT_ERR_OK;
      bVar8 = true;
LAB_001f101d:
      if (serror != (ScriptError *)0x0) {
        *serror = SVar12;
      }
    }
    else {
      uVar11 = (scriptSig->super_CScriptBase)._size;
      uVar13 = uVar11 - 0x1d;
      if (uVar11 < 0x1d) {
        uVar13 = uVar11;
      }
      if (uVar13 != 0) {
        SVar12 = SCRIPT_ERR_WITNESS_MALLEATED;
LAB_001f101b:
        bVar8 = false;
        goto LAB_001f101d;
      }
      bVar8 = VerifyWitnessProgram(witness_00,local_11c,&local_138,flags,checker,serror,false);
      if (bVar8) {
        bVar8 = true;
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::resize(&local_f8,1);
        goto LAB_001f0cf4;
      }
LAB_001f1044:
      bVar8 = false;
    }
    if (local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_001f0cad:
    bVar8 = false;
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_118);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_f8);
LAB_001f0cc6:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool VerifyScript(const CScript& scriptSig, const CScript& scriptPubKey, const CScriptWitness* witness, unsigned int flags, const BaseSignatureChecker& checker, ScriptError* serror)
{
    static const CScriptWitness emptyWitness;
    if (witness == nullptr) {
        witness = &emptyWitness;
    }
    bool hadWitness = false;

    set_error(serror, SCRIPT_ERR_UNKNOWN_ERROR);

    if ((flags & SCRIPT_VERIFY_SIGPUSHONLY) != 0 && !scriptSig.IsPushOnly()) {
        return set_error(serror, SCRIPT_ERR_SIG_PUSHONLY);
    }

    // scriptSig and scriptPubKey must be evaluated sequentially on the same stack
    // rather than being simply concatenated (see CVE-2010-5141)
    std::vector<std::vector<unsigned char> > stack, stackCopy;
    if (!EvalScript(stack, scriptSig, flags, checker, SigVersion::BASE, serror))
        // serror is set
        return false;
    if (flags & SCRIPT_VERIFY_P2SH)
        stackCopy = stack;
    if (!EvalScript(stack, scriptPubKey, flags, checker, SigVersion::BASE, serror))
        // serror is set
        return false;
    if (stack.empty())
        return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
    if (CastToBool(stack.back()) == false)
        return set_error(serror, SCRIPT_ERR_EVAL_FALSE);

    // Bare witness programs
    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (flags & SCRIPT_VERIFY_WITNESS) {
        if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
            hadWitness = true;
            if (scriptSig.size() != 0) {
                // The scriptSig must be _exactly_ CScript(), otherwise we reintroduce malleability.
                return set_error(serror, SCRIPT_ERR_WITNESS_MALLEATED);
            }
            if (!VerifyWitnessProgram(*witness, witnessversion, witnessprogram, flags, checker, serror, /*is_p2sh=*/false)) {
                return false;
            }
            // Bypass the cleanstack check at the end. The actual stack is obviously not clean
            // for witness programs.
            stack.resize(1);
        }
    }

    // Additional validation for spend-to-script-hash transactions:
    if ((flags & SCRIPT_VERIFY_P2SH) && scriptPubKey.IsPayToScriptHash())
    {
        // scriptSig must be literals-only or validation fails
        if (!scriptSig.IsPushOnly())
            return set_error(serror, SCRIPT_ERR_SIG_PUSHONLY);

        // Restore stack.
        swap(stack, stackCopy);

        // stack cannot be empty here, because if it was the
        // P2SH  HASH <> EQUAL  scriptPubKey would be evaluated with
        // an empty stack and the EvalScript above would return false.
        assert(!stack.empty());

        const valtype& pubKeySerialized = stack.back();
        CScript pubKey2(pubKeySerialized.begin(), pubKeySerialized.end());
        popstack(stack);

        if (!EvalScript(stack, pubKey2, flags, checker, SigVersion::BASE, serror))
            // serror is set
            return false;
        if (stack.empty())
            return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
        if (!CastToBool(stack.back()))
            return set_error(serror, SCRIPT_ERR_EVAL_FALSE);

        // P2SH witness program
        if (flags & SCRIPT_VERIFY_WITNESS) {
            if (pubKey2.IsWitnessProgram(witnessversion, witnessprogram)) {
                hadWitness = true;
                if (scriptSig != CScript() << std::vector<unsigned char>(pubKey2.begin(), pubKey2.end())) {
                    // The scriptSig must be _exactly_ a single push of the redeemScript. Otherwise we
                    // reintroduce malleability.
                    return set_error(serror, SCRIPT_ERR_WITNESS_MALLEATED_P2SH);
                }
                if (!VerifyWitnessProgram(*witness, witnessversion, witnessprogram, flags, checker, serror, /*is_p2sh=*/true)) {
                    return false;
                }
                // Bypass the cleanstack check at the end. The actual stack is obviously not clean
                // for witness programs.
                stack.resize(1);
            }
        }
    }

    // The CLEANSTACK check is only performed after potential P2SH evaluation,
    // as the non-P2SH evaluation of a P2SH script will obviously not result in
    // a clean stack (the P2SH inputs remain). The same holds for witness evaluation.
    if ((flags & SCRIPT_VERIFY_CLEANSTACK) != 0) {
        // Disallow CLEANSTACK without P2SH, as otherwise a switch CLEANSTACK->P2SH+CLEANSTACK
        // would be possible, which is not a softfork (and P2SH should be one).
        assert((flags & SCRIPT_VERIFY_P2SH) != 0);
        assert((flags & SCRIPT_VERIFY_WITNESS) != 0);
        if (stack.size() != 1) {
            return set_error(serror, SCRIPT_ERR_CLEANSTACK);
        }
    }

    if (flags & SCRIPT_VERIFY_WITNESS) {
        // We can't check for correct unexpected witness data if P2SH was off, so require
        // that WITNESS implies P2SH. Otherwise, going from WITNESS->P2SH+WITNESS would be
        // possible, which is not a softfork.
        assert((flags & SCRIPT_VERIFY_P2SH) != 0);
        if (!hadWitness && !witness->IsNull()) {
            return set_error(serror, SCRIPT_ERR_WITNESS_UNEXPECTED);
        }
    }

    return set_success(serror);
}